

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

bool __thiscall QMessageBoxPrivate::canBeNativeDialog(QMessageBoxPrivate *this)

{
  QWidget *this_00;
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *__s1;
  char *__s2;
  iterator iVar5;
  iterator iVar6;
  QPushButton *this_01;
  QMenu *pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<QAbstractButton_*> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = true;
  if ((this->super_QDialogPrivate).nativeDialogInUse == false) {
    this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    cVar1 = QCoreApplication::testAttribute(AA_DontUseNativeDialogs);
    if (cVar1 == '\0') {
      bVar2 = QWidget::testAttribute_helper(this_00,WA_DontShowOnScreen);
      if (!bVar2) {
        bVar2 = QWidget::testAttribute_helper(this_00,WA_StyleSheet);
        if (!bVar2) {
          uVar4 = QMessageDialogOptions::options();
          if ((uVar4 & 1) == 0) {
            __s1 = (char *)QMetaObject::className();
            (*(code *)**(undefined8 **)this_00)(this_00);
            __s2 = (char *)QMetaObject::className();
            iVar3 = strcmp(__s1,__s2);
            if (iVar3 == 0) {
              QDialogButtonBox::buttons
                        ((QList<QAbstractButton_*> *)&QStack_38,(QDialogButtonBox *)this->buttonBox)
              ;
              iVar5 = QList<QAbstractButton_*>::begin((QList<QAbstractButton_*> *)&QStack_38);
              iVar6 = QList<QAbstractButton_*>::end((QList<QAbstractButton_*> *)&QStack_38);
              for (; iVar5.i != iVar6.i; iVar5.i = iVar5.i + 1) {
                this_01 = QtPrivate::qobject_cast_helper<QPushButton*,QObject>((QObject *)*iVar5.i);
                if (this_01 != (QPushButton *)0x0) {
                  pQVar7 = QPushButton::menu(this_01);
                  if (pQVar7 != (QMenu *)0x0) {
                    QArrayDataPointer<QAbstractButton_*>::~QArrayDataPointer(&QStack_38);
                    goto LAB_004bbd6d;
                  }
                }
              }
              QArrayDataPointer<QAbstractButton_*>::~QArrayDataPointer(&QStack_38);
              bVar2 = QDialogPrivate::canBeNativeDialog(&this->super_QDialogPrivate);
              goto LAB_004bbd6f;
            }
          }
        }
      }
    }
LAB_004bbd6d:
    bVar2 = false;
  }
LAB_004bbd6f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMessageBoxPrivate::canBeNativeDialog() const
{
    // Don't use Q_Q here! This function is called from ~QDialog,
    // so Q_Q calling q_func() invokes undefined behavior (invalid cast in q_func()).
    const QDialog * const q = static_cast<const QDialog*>(q_ptr);
    if (nativeDialogInUse)
        return true;
    if (QCoreApplication::testAttribute(Qt::AA_DontUseNativeDialogs)
        || q->testAttribute(Qt::WA_DontShowOnScreen)
        || q->testAttribute(Qt::WA_StyleSheet)
        || (options->options() & QMessageDialogOptions::Option::DontUseNativeDialog)) {
        return false;
    }

    if (strcmp(QMessageBox::staticMetaObject.className(), q->metaObject()->className()) != 0)
        return false;

#if QT_CONFIG(menu)
    for (auto *customButton : buttonBox->buttons()) {
        if (QPushButton *pushButton = qobject_cast<QPushButton *>(customButton)) {
            // We can't support buttons with menus in native dialogs (yet)
            if (pushButton->menu())
                return false;
        }
    }
#endif

    return QDialogPrivate::canBeNativeDialog();
}